

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_waveops.cpp
# Opt level: O0

bool dxil_spv::emit_wave_quad_vote_instruction(Impl *impl,CallInst *instruction)

{
  CallInst *pCVar1;
  bool bVar2;
  Op op_00;
  Id IVar3;
  Builder *this;
  Operation *pOVar4;
  Value *pVVar5;
  HelperCall call;
  Operation *op_1;
  Id call_id;
  Operation *op;
  Op opcode;
  Builder *builder;
  CallInst *pCStack_20;
  uint32_t vote_kind;
  CallInst *instruction_local;
  Impl *impl_local;
  
  pCStack_20 = instruction;
  instruction_local = (CallInst *)impl;
  bVar2 = get_constant_operand(&instruction->super_Instruction,2,(uint32_t *)((long)&builder + 4));
  if (bVar2) {
    if (((ulong)instruction_local[0x19].super_Instruction.attachments._M_h._M_buckets &
        0x10000000000) == 0) {
      call = QuadAny;
      if (builder._4_4_ != 0) {
        call = QuadAll;
      }
      IVar3 = SPIRVModule::get_helper_call_id
                        ((SPIRVModule *)(instruction_local->super_Instruction).super_Value.tween_id,
                         call,0);
      pOVar4 = Converter::Impl::allocate
                         ((Impl *)instruction_local,OpFunctionCall,(Value *)pCStack_20);
      Operation::add_id(pOVar4,IVar3);
      pCVar1 = instruction_local;
      pVVar5 = LLVMBC::Instruction::getOperand(&pCStack_20->super_Instruction,1);
      IVar3 = Converter::Impl::get_id_for_value((Impl *)pCVar1,pVVar5,0);
      Operation::add_id(pOVar4,IVar3);
      Converter::Impl::add((Impl *)instruction_local,pOVar4,false);
    }
    else {
      this = Converter::Impl::builder((Impl *)instruction_local);
      spv::Builder::addExtension(this,"SPV_KHR_quad_control");
      spv::Builder::addCapability(this,CapabilityQuadControlKHR);
      op_00 = OpGroupNonUniformQuadAnyKHR;
      if (builder._4_4_ != 0) {
        op_00 = OpGroupNonUniformQuadAllKHR;
      }
      pOVar4 = Converter::Impl::allocate((Impl *)instruction_local,op_00,(Value *)pCStack_20);
      pCVar1 = instruction_local;
      pVVar5 = LLVMBC::Instruction::getOperand(&pCStack_20->super_Instruction,1);
      IVar3 = Converter::Impl::get_id_for_value((Impl *)pCVar1,pVVar5,0);
      Operation::add_id(pOVar4,IVar3);
      Converter::Impl::add((Impl *)instruction_local,pOVar4,false);
    }
    if ((int)instruction_local[1].super_Instruction.attachments._M_h._M_rehash_policy._M_next_resize
        == 4) {
      *(undefined1 *)
       &instruction_local[0xc].super_Instruction.attachments._M_h._M_before_begin._M_nxt = 1;
    }
    impl_local._7_1_ = true;
  }
  else {
    impl_local._7_1_ = false;
  }
  return impl_local._7_1_;
}

Assistant:

bool emit_wave_quad_vote_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	uint32_t vote_kind;
	if (!get_constant_operand(instruction, 2, &vote_kind))
		return false;

	if (impl.options.supports_quad_control)
	{
		auto &builder = impl.builder();
		builder.addExtension("SPV_KHR_quad_control");
		builder.addCapability(spv::CapabilityQuadControlKHR);

		spv::Op opcode = vote_kind ? spv::OpGroupNonUniformQuadAllKHR : spv::OpGroupNonUniformQuadAnyKHR;

		auto *op = impl.allocate(opcode, instruction);
		op->add_id(impl.get_id_for_value(instruction->getOperand(1)));
		impl.add(op);
	}
	else
	{
		// All lanes must be active according to SM 6.7 (and backed up by tests), so quadBroadcast
		// pattern is valid and can be optimized by compilers into the intrinsic short form.
		spv::Id call_id = impl.spirv_module.get_helper_call_id(vote_kind ? HelperCall::QuadAll : HelperCall::QuadAny);

		auto *op = impl.allocate(spv::OpFunctionCall, instruction);
		op->add_id(call_id);
		op->add_id(impl.get_id_for_value(instruction->getOperand(1)));
		impl.add(op);
	}

	if (impl.execution_model == spv::ExecutionModelFragment)
		impl.execution_mode_meta.needs_quad_derivatives = true;

	return true;
}